

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

void __thiscall
google::protobuf::io::CodedOutputStream::WriteVarint64(CodedOutputStream *this,uint64 value)

{
  uint8 *target_00;
  uint8 *puVar1;
  int size;
  uint8 *end;
  uint8 *target;
  uint64 value_local;
  CodedOutputStream *this_local;
  
  if (this->buffer_size_ < 10) {
    WriteVarint64SlowPath(this,value);
  }
  else {
    target_00 = this->buffer_;
    puVar1 = WriteVarint64ToArray(value,target_00);
    Advance(this,(int)puVar1 - (int)target_00);
  }
  return;
}

Assistant:

inline void CodedOutputStream::WriteVarint64(uint64 value) {
  if (buffer_size_ >= 10) {
    // Fast path:  We have enough bytes left in the buffer to guarantee that
    // this write won't cross the end, so we can skip the checks.
    uint8* target = buffer_;
    uint8* end = WriteVarint64ToArray(value, target);
    int size = static_cast<int>(end - target);
    Advance(size);
  } else {
    WriteVarint64SlowPath(value);
  }
}